

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O2

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,string *hex)

{
  CfdException *this_00;
  undefined1 local_88 [32];
  unsigned_long local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_006f26d0;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(string *)hex);
  local_28.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_48._M_impl.super__Vector_impl_data._M_finish;
  local_30.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_48._M_impl.super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&reverse_buffer,&local_28,
             &local_30,(allocator_type *)local_88);
  local_68 = (long)reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (local_68 == 0x20) {
    ByteData::ByteData((ByteData *)local_88,&reverse_buffer);
    ByteData::operator=(&this->data_,(ByteData *)local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    return;
  }
  local_88._0_8_ = "cfdcore_coin.cpp";
  local_88._8_4_ = 0x4f;
  local_88._16_8_ = "BlockHash";
  logger::warn<unsigned_long>
            ((CfdSourceLocation *)local_88,"BlockHash size Invalid. size={}.",&local_68);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_88,"BlockHash size Invalid.",(allocator *)&local_68);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlockHash::BlockHash(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(
        CFD_LOG_SOURCE, "BlockHash size Invalid. size={}.",
        reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "BlockHash size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}